

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdsa_anti_exfil_signer_commit
              (secp256k1_context *ctx,secp256k1_ecdsa_s2c_opening *opening,uchar *msg32,
              uchar *seckey32,uchar *rand_commitment32)

{
  uint counter;
  secp256k1_scalar k;
  uchar nonce32 [32];
  secp256k1_gej rj;
  secp256k1_ge r;
  secp256k1_scalar local_148;
  uchar local_128 [32];
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  if ((ctx->ecmult_gen_ctx).built == 0) {
    secp256k1_ecdsa_anti_exfil_signer_commit_cold_5();
  }
  else if (opening == (secp256k1_ecdsa_s2c_opening *)0x0) {
    secp256k1_ecdsa_anti_exfil_signer_commit_cold_4();
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_ecdsa_anti_exfil_signer_commit_cold_3();
  }
  else if (seckey32 == (uchar *)0x0) {
    secp256k1_ecdsa_anti_exfil_signer_commit_cold_2();
  }
  else {
    if (rand_commitment32 != (uchar *)0x0) {
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      local_128[0x18] = '\0';
      local_128[0x19] = '\0';
      local_128[0x1a] = '\0';
      local_128[0x1b] = '\0';
      local_128[0x1c] = '\0';
      local_128[0x1d] = '\0';
      local_128[0x1e] = '\0';
      local_128[0x1f] = '\0';
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = '\0';
      local_128[9] = '\0';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      counter = 0;
      do {
        do {
          nonce_function_rfc6979(local_128,msg32,seckey32,(uchar *)0x0,rand_commitment32,counter);
          secp256k1_scalar_set_b32(&local_148,local_128,(int *)&local_108);
          counter = counter + 1;
        } while ((int)local_108.x.n[0] != 0);
      } while (((local_148.d[1] == 0 && local_148.d[0] == 0) && local_148.d[2] == 0) &&
               local_148.d[3] == 0);
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_108,&local_148);
      secp256k1_ge_set_gej(&local_88,&local_108);
      secp256k1_pubkey_save((secp256k1_pubkey *)opening,&local_88);
      return 1;
    }
    secp256k1_ecdsa_anti_exfil_signer_commit_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_anti_exfil_signer_commit(const secp256k1_context* ctx, secp256k1_ecdsa_s2c_opening* opening, const unsigned char* msg32, const unsigned char* seckey32, const unsigned char* rand_commitment32) {
    unsigned char nonce32[32];
    secp256k1_scalar k;
    secp256k1_gej rj;
    secp256k1_ge r;
    unsigned int count = 0;
    int is_nonce_valid = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(opening != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(rand_commitment32 != NULL);

    memset(nonce32, 0, 32);
    while (!is_nonce_valid) {
        /* cast to void* removes const qualifier, but secp256k1_nonce_function_default does not modify it */
        if (!secp256k1_nonce_function_default(nonce32, msg32, seckey32, NULL, (void*)rand_commitment32, count)) {
            secp256k1_callback_call(&ctx->error_callback, "(cryptographically unreachable) generated bad nonce");
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&k, nonce32);
        /* The nonce is still secret here, but it being invalid is is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        count++;
    }

    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rj, &k);
    secp256k1_ge_set_gej(&r, &rj);
    secp256k1_ecdsa_s2c_opening_save(opening, &r);
    memset(nonce32, 0, 32);
    secp256k1_scalar_clear(&k);
    return 1;
}